

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterReader.cpp
# Opt level: O1

void __thiscall
ParameterReader::phraseOneLine(ParameterReader *this,string *str,string *commentSymbol)

{
  pointer pcVar1;
  int iVar2;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + str->_M_string_length);
  AfterburnerUtil::trim(&local_50,&local_70);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (iVar2 != 0) {
    pcVar1 = (str->_M_dataplus)._M_p;
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,pcVar1,pcVar1 + str->_M_string_length);
    pcVar1 = (commentSymbol->_M_dataplus)._M_p;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,pcVar1,pcVar1 + commentSymbol->_M_string_length);
    std::__cxx11::string::find((char *)local_b0,(ulong)local_d0[0],0);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)local_b0);
    phraseEquationWithoutComments(this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
  }
  return;
}

Assistant:

void ParameterReader::phraseOneLine(string str, string commentSymbol) {
    /*
      Interpret a string like " x  = 1.1  #bla " to get the associated parameter
      name and value information, and put them into the internal variables
      "names" and "values".
    */
    if (trim(str).compare("") == 0) return;
    phraseEquationWithoutComments(removeComments(str, commentSymbol));
}